

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::~EigenDecompositionCube
          (EigenDecompositionCube<float,_1> *this)

{
  int i;
  long lVar1;
  
  (this->super_EigenDecomposition<float,_1>)._vptr_EigenDecomposition =
       (_func_int **)&PTR__EigenDecompositionCube_001597a8;
  for (lVar1 = 0; lVar1 < (this->super_EigenDecomposition<float,_1>).kEigenDecompCount;
      lVar1 = lVar1 + 1) {
    free(this->gCMatrices[lVar1]);
    free((this->super_EigenDecomposition<float,_1>).gEigenValues[lVar1]);
  }
  free(this->gCMatrices);
  free((this->super_EigenDecomposition<float,_1>).gEigenValues);
  free((this->super_EigenDecomposition<float,_1>).matrixTmp);
  free((this->super_EigenDecomposition<float,_1>).firstDerivTmp);
  free((this->super_EigenDecomposition<float,_1>).secondDerivTmp);
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::~EigenDecompositionCube() {

	for(int i=0; i<kEigenDecompCount; i++) {
		free(gCMatrices[i]);
		free(gEigenValues[i]);
	}
	free(gCMatrices);
	free(gEigenValues);
	free(matrixTmp);
	free(firstDerivTmp);
	free(secondDerivTmp);
}